

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NodeRemoveNonCurrentObjects(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *p;
  int iVar2;
  int i;
  
  iVar2 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    p = Abc_NtkObj(pNtk,i);
    if (p != (Abc_Obj_t *)0x0) {
      iVar1 = Abc_NodeIsTravIdCurrent(p);
      if (iVar1 == 0) {
        Abc_NtkDeleteObj(p);
        iVar2 = iVar2 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int Abc_NodeRemoveNonCurrentObjects( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int Counter, i;
    int fVerbose = 0;

    // report on the nodes to be deleted
    if ( fVerbose )
    {
        printf( "These nodes will be deleted: \n" );
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( !Abc_NodeIsTravIdCurrent( pObj ) )
            {
                printf( "    " );
                Abc_ObjPrint( stdout, pObj );
            }
    }
    
    // delete the nodes    
    Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent( pObj ) )
        {
            Abc_NtkDeleteObj( pObj );
            Counter++;
        }
    return Counter;
}